

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

int glfwInit(void)

{
  GLFWbool GVar1;
  int local_c;
  
  if (_glfw.initialized == 0) {
    memset(&_glfw,0,0x21f70);
    memcpy(&_glfw.hints,&_glfwInitHints,0x28);
    _glfw.allocator.allocate = _glfwInitAllocator.allocate;
    _glfw.allocator.reallocate = _glfwInitAllocator.reallocate;
    _glfw.allocator.deallocate = _glfwInitAllocator.deallocate;
    _glfw.allocator.user = _glfwInitAllocator.user;
    if (_glfwInitAllocator.allocate == (GLFWallocatefun)0x0) {
      _glfw.allocator.allocate = defaultAllocate;
      _glfw.allocator.reallocate = defaultReallocate;
      _glfw.allocator.deallocate = defaultDeallocate;
    }
    GVar1 = _glfwSelectPlatform(_glfw.hints.init.platformID,&_glfw.platform);
    if (GVar1 == 0) {
      local_c = 0;
    }
    else {
      GVar1 = (*_glfw.platform.init)();
      if (GVar1 == 0) {
        terminate();
        local_c = 0;
      }
      else {
        GVar1 = _glfwPlatformCreateMutex(&_glfw.errorLock);
        if (((GVar1 != 0) && (GVar1 = _glfwPlatformCreateTls(&_glfw.errorSlot), GVar1 != 0)) &&
           (GVar1 = _glfwPlatformCreateTls(&_glfw.contextSlot), GVar1 != 0)) {
          _glfwPlatformSetTls(&_glfw.errorSlot,&_glfwMainThreadError);
          _glfwInitGamepadMappings();
          _glfwPlatformInitTimer();
          _glfw.timer.offset = _glfwPlatformGetTimerValue();
          _glfw.initialized = 1;
          glfwDefaultWindowHints();
          return 1;
        }
        terminate();
        local_c = 0;
      }
    }
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

GLFWAPI int glfwInit(void)
{
    if (_glfw.initialized)
        return GLFW_TRUE;

    memset(&_glfw, 0, sizeof(_glfw));
    _glfw.hints.init = _glfwInitHints;

    _glfw.allocator = _glfwInitAllocator;
    if (!_glfw.allocator.allocate)
    {
        _glfw.allocator.allocate   = defaultAllocate;
        _glfw.allocator.reallocate = defaultReallocate;
        _glfw.allocator.deallocate = defaultDeallocate;
    }

    if (!_glfwSelectPlatform(_glfw.hints.init.platformID, &_glfw.platform))
        return GLFW_FALSE;

    if (!_glfw.platform.init())
    {
        terminate();
        return GLFW_FALSE;
    }

    if (!_glfwPlatformCreateMutex(&_glfw.errorLock) ||
        !_glfwPlatformCreateTls(&_glfw.errorSlot) ||
        !_glfwPlatformCreateTls(&_glfw.contextSlot))
    {
        terminate();
        return GLFW_FALSE;
    }

    _glfwPlatformSetTls(&_glfw.errorSlot, &_glfwMainThreadError);

    _glfwInitGamepadMappings();

    _glfwPlatformInitTimer();
    _glfw.timer.offset = _glfwPlatformGetTimerValue();

    _glfw.initialized = GLFW_TRUE;

    glfwDefaultWindowHints();
    return GLFW_TRUE;
}